

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkSets.c
# Opt level: O2

void Lpk_ComposeSets(Vec_Int_t *vSets0,Vec_Int_t *vSets1,int nVars,int iCofVar,Lpk_Set_t *pStore,
                    int *pSize,int nSizeLimit)

{
  ushort uVar1;
  int iVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  uint i;
  long lVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  
  iVar16 = Lpk_ComposeSets::nTravId;
  if (Lpk_ComposeSets::nTravId == 0x40000000) {
    memset(Lpk_ComposeSets::TravId,0,0x40000);
  }
  Lpk_ComposeSets::nTravId = iVar16 + 1;
  uVar4 = Kit_BitMask(nVars);
  i = 0;
  uVar14 = 0;
  do {
    if (vSets0->nSize <= (int)i) {
      uVar9 = 0;
      uVar12 = (ulong)uVar14;
      if ((int)uVar14 < 1) {
        uVar12 = 0;
      }
      iVar16 = 1000;
      for (; (uint)((int)uVar12 * 2) != uVar9; uVar9 = uVar9 + 2) {
        if (Lpk_ComposeSets::Over[*(ushort *)((long)Lpk_ComposeSets::Used + uVar9)] <= iVar16) {
          iVar16 = (int)Lpk_ComposeSets::Over[*(ushort *)((long)Lpk_ComposeSets::Used + uVar9)];
        }
      }
      lVar13 = 0;
      do {
        if (uVar12 * 2 == lVar13) {
          return;
        }
        uVar1 = *(ushort *)((long)Lpk_ComposeSets::Used + lVar13);
        if (iVar16 == Lpk_ComposeSets::Over[uVar1]) {
          iVar2 = *pSize;
          if (iVar2 == nSizeLimit) {
            return;
          }
          *pSize = iVar2 + 1;
          uVar14 = Lpk_ComposeSets::Parents[uVar1];
          uVar4 = Vec_IntEntry(vSets0,uVar14 & 0xffff);
          pStore[iVar2].uSubset0 = uVar4;
          uVar14 = Vec_IntEntry(vSets1,uVar14 >> 0x10);
          pStore[iVar2].uSubset1 = uVar14;
          uVar14 = uVar14 | pStore[iVar2].uSubset0;
          pStore[iVar2].iVar = (char)iCofVar;
          iVar8 = Kit_WordCountOnes(uVar14 & 0xffff);
          pStore[iVar2].Size = (char)iVar8;
          iVar11 = Kit_WordCountOnes(uVar14 >> 0x10 & uVar14);
          pStore[iVar2].Over = (byte)iVar11;
          cVar3 = ~(byte)iVar11 + (char)iVar8;
          pStore[iVar2].SRed = cVar3;
          if (cVar3 < '\x01') {
            __assert_fail("pEntry->SRed > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkSets.c"
                          ,0x11a,
                          "void Lpk_ComposeSets(Vec_Int_t *, Vec_Int_t *, int, int, Lpk_Set_t *, int *, int)"
                         );
          }
        }
        lVar13 = lVar13 + 2;
      } while( true );
    }
    uVar5 = Vec_IntEntry(vSets0,i);
    uVar15 = uVar5 & 0xffff;
    uVar10 = uVar15 - (uVar5 >> 1 & 0x5555);
    uVar10 = (uVar10 >> 2 & 0x33333333) + (uVar10 & 0x33333333);
    uVar17 = 0;
    for (iVar16 = 0; iVar16 < vSets1->nSize; iVar16 = iVar16 + 1) {
      uVar6 = Vec_IntEntry(vSets1,iVar16);
      if ((((uVar15 != 0) && (uVar7 = uVar6 & 0xffff, uVar7 != 0)) &&
          ((uVar7 | uVar15) != (uVar4 & ~(1 << (iCofVar & 0x1fU))))) &&
         ((1 < ((uVar10 >> 4) + uVar10 & 0xf0f0f0f) * 0x1010101 >> 0x18 ||
          (uVar7 = uVar7 - (uVar7 >> 1 & 0x5555),
          uVar7 = (uVar7 >> 2 & 0x33333333) + (uVar7 & 0x33333333),
          1 < ((uVar7 >> 4) + uVar7 & 0xf0f0f0f) * 0x1010101 >> 0x18)))) {
        uVar6 = uVar6 | uVar5;
        uVar9 = (ulong)uVar6 & 0xffff;
        iVar8 = Kit_WordCountOnes((uint)uVar9);
        uVar7 = Kit_WordCountOnes(uVar6 >> 0x10 & uVar6);
        iVar2 = Lpk_ComposeSets::nTravId;
        iVar11 = ~uVar7 + iVar8;
        if (iVar11 != 0 && SCARRY4(~uVar7,iVar8) == iVar11 < 0) {
          if (Lpk_ComposeSets::TravId[uVar9] < Lpk_ComposeSets::nTravId) {
            lVar13 = (long)(int)uVar14;
            uVar14 = uVar14 + 1;
            Lpk_ComposeSets::Used[lVar13] = (unsigned_short)uVar6;
            Lpk_ComposeSets::TravId[uVar9] = iVar2;
            Lpk_ComposeSets::SRed[uVar9] = (char)iVar11;
          }
          else {
            if ((Lpk_ComposeSets::TravId[uVar9] != Lpk_ComposeSets::nTravId) ||
               (iVar11 <= Lpk_ComposeSets::SRed[uVar9])) goto LAB_0041c0ec;
            Lpk_ComposeSets::SRed[uVar9] = (char)iVar11;
          }
          Lpk_ComposeSets::Over[uVar9] = (char)uVar7;
          Lpk_ComposeSets::Parents[uVar9] = uVar17 | i;
        }
      }
LAB_0041c0ec:
      uVar17 = uVar17 + 0x10000;
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Lpk_ComposeSets( Vec_Int_t * vSets0, Vec_Int_t * vSets1, int nVars, int iCofVar,
    Lpk_Set_t * pStore, int * pSize, int nSizeLimit )
{
    static int nTravId = 0;            // the number of the times this is visited
    static int TravId[1<<16] = {0};    // last visited
    static char SRed[1<<16];           // best support reduction
    static char Over[1<<16];           // best overlaps
    static unsigned Parents[1<<16];    // best set of parents
    static unsigned short Used[1<<16]; // storage for used subsets
    int nSuppSize, nSuppOver, nSuppRed, nUsed, nMinOver, i, k, s;
    unsigned Entry, Entry0, Entry1;
    unsigned uSupp, uSupp0, uSupp1, uSuppTotal;
    Lpk_Set_t * pEntry;

    if ( nTravId == (1 << 30) )
        memset( TravId, 0, sizeof(int) * (1 << 16) );

    // collect support reducing subsets
    nUsed = 0;
    nTravId++;
    uSuppTotal = Kit_BitMask(nVars) & ~(1<<iCofVar);
    Vec_IntForEachEntry( vSets0, Entry0, i )
    Vec_IntForEachEntry( vSets1, Entry1, k )
    {
        uSupp0 = (Entry0 & 0xFFFF);
        uSupp1 = (Entry1 & 0xFFFF);
        // skip trivial
        if ( uSupp0 == 0 || uSupp1 == 0 || (uSupp0 | uSupp1) == uSuppTotal )
            continue;
        if ( Kit_WordHasOneBit(uSupp0) && Kit_WordHasOneBit(uSupp1) )
            continue;
        // get the entry
        Entry = Entry0 | Entry1;
        uSupp = Entry & 0xFFFF;
        // set the bound set size
        nSuppSize = Kit_WordCountOnes( uSupp );
        // get the number of overlapping vars
        nSuppOver = Kit_WordCountOnes( Entry & (Entry >> 16) );
        // get the support reduction
        nSuppRed  = nSuppSize - 1 - nSuppOver;
        // only consider support-reducing subsets
        if ( nSuppRed <= 0 )
            continue;
        // check if this support is already used
        if ( TravId[uSupp] < nTravId )
        {
            Used[nUsed++] = uSupp;

            TravId[uSupp] = nTravId;
            SRed[uSupp] = nSuppRed;
            Over[uSupp] = nSuppOver;
            Parents[uSupp] = (k << 16) | i;
        }
        else if ( TravId[uSupp] == nTravId && SRed[uSupp] < nSuppRed )
        {
            TravId[uSupp] = nTravId;
            SRed[uSupp] = nSuppRed;
            Over[uSupp] = nSuppOver;
            Parents[uSupp] = (k << 16) | i;
        }
    }

    // find the minimum overlap
    nMinOver = 1000;
    for ( s = 0; s < nUsed; s++ )
        if ( nMinOver > Over[Used[s]] )
            nMinOver = Over[Used[s]];


    // collect the accumulated ones
    for ( s = 0; s < nUsed; s++ )
        if ( Over[Used[s]] == nMinOver )
        {
            // save the entry
            if ( *pSize == nSizeLimit )
                return;
            pEntry = pStore + (*pSize)++;

            i = Parents[Used[s]] & 0xFFFF;
            k = Parents[Used[s]] >> 16;

            pEntry->uSubset0 = Vec_IntEntry(vSets0, i);
            pEntry->uSubset1 = Vec_IntEntry(vSets1, k);
            Entry  = pEntry->uSubset0 | pEntry->uSubset1;

            // record the cofactoring variable
            pEntry->iVar = iCofVar;
            // set the bound set size
            pEntry->Size = Kit_WordCountOnes( Entry & 0xFFFF );
            // get the number of overlapping vars
            pEntry->Over = Kit_WordCountOnes( Entry & (Entry >> 16) );
            // get the support reduction
            pEntry->SRed = pEntry->Size - 1 - pEntry->Over;
            assert( pEntry->SRed > 0 );
        }
}